

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pl_MD5.cc
# Opt level: O2

void __thiscall Pl_MD5::Pl_MD5(Pl_MD5 *this,char *identifier,Pipeline *next)

{
  logic_error *this_00;
  uchar *in_RCX;
  size_t n;
  
  Pipeline::Pipeline(&this->super_Pipeline,identifier,next);
  (this->super_Pipeline)._vptr_Pipeline = (_func_int **)&PTR__Pl_MD5_002ac5b8;
  this->in_progress = false;
  MD5::MD5(&this->md5,(uchar *)identifier,n,in_RCX);
  this->enabled = true;
  this->persist_across_finish = false;
  if (next != (Pipeline *)0x0) {
    return;
  }
  this_00 = (logic_error *)__cxa_allocate_exception(0x10);
  std::logic_error::logic_error(this_00,"Attempt to create Pl_MD5 with nullptr as next");
  __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
}

Assistant:

Pl_MD5::Pl_MD5(char const* identifier, Pipeline* next) :
    Pipeline(identifier, next)
{
    if (!next) {
        throw std::logic_error("Attempt to create Pl_MD5 with nullptr as next");
    }
}